

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

string * __thiscall
duckdb::StringUtil::BytesToHumanReadableString_abi_cxx11_
          (string *__return_storage_ptr__,StringUtil *this,idx_t bytes,idx_t multiplier)

{
  undefined8 *puVar1;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  undefined8 *puVar5;
  long *plVar6;
  idx_t i;
  long lVar7;
  StringUtil *pSVar8;
  StringUtil *pSVar9;
  ulong *puVar10;
  ulong uVar11;
  long *plVar12;
  size_type *psVar13;
  char cVar14;
  idx_t array [6];
  string __str;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  ulong local_d8 [2];
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  ulong uStack_90;
  StringUtil *local_88 [7];
  long *local_50;
  uint local_48;
  long local_40 [2];
  
  local_88[1] = (StringUtil *)0x0;
  local_88[4] = (StringUtil *)0x0;
  local_88[5] = (StringUtil *)0x0;
  local_88[2] = (StringUtil *)0x0;
  local_88[3] = (StringUtil *)0x0;
  local_88[0] = this;
  lVar7 = 1;
  do {
    local_88[lVar7] = (StringUtil *)((ulong)this / bytes);
    (&uStack_90)[lVar7] = (ulong)this % bytes;
    pSVar9 = local_88[0];
    lVar7 = lVar7 + 1;
    this = (StringUtil *)((ulong)this / bytes);
  } while (lVar7 != 6);
  lVar7 = 5;
  do {
    pSVar8 = local_88[lVar7];
    lVar7 = lVar7 + -1;
    if (pSVar8 != (StringUtil *)0x0) {
      cVar14 = '\x01';
      if (pSVar8 < (StringUtil *)0xa) goto LAB_013f24cc;
      pSVar9 = pSVar8;
      cVar3 = '\x04';
      goto LAB_013f248f;
    }
  } while (lVar7 != 0);
  cVar14 = '\x01';
  if ((StringUtil *)0x9 < local_88[0]) {
    pSVar8 = local_88[0];
    cVar3 = '\x04';
    do {
      cVar14 = cVar3;
      if (pSVar8 < (StringUtil *)0x64) {
        cVar14 = cVar14 + -2;
        goto LAB_013f27c9;
      }
      if (pSVar8 < (StringUtil *)0x3e8) {
        cVar14 = cVar14 + -1;
        goto LAB_013f27c9;
      }
      if (pSVar8 < (StringUtil *)0x2710) goto LAB_013f27c9;
      bVar2 = (StringUtil *)0x1869f < pSVar8;
      pSVar8 = (StringUtil *)((ulong)pSVar8 / 10000);
      cVar3 = cVar14 + '\x04';
    } while (bVar2);
    cVar14 = cVar14 + '\x01';
  }
LAB_013f27c9:
  local_a8 = &local_98;
  ::std::__cxx11::string::_M_construct((ulong)&local_a8,cVar14);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_a8,(uint)local_a0,(unsigned_long)pSVar9);
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar13 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar13) {
    lVar7 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = local_a8;
  if (local_a8 == &local_98) {
    return __return_storage_ptr__;
  }
  goto LAB_013f27ad;
  while( true ) {
    if (pSVar9 < (StringUtil *)0x2710) goto LAB_013f24cc;
    bVar2 = pSVar9 < (StringUtil *)0x186a0;
    pSVar9 = (StringUtil *)((ulong)pSVar9 / 10000);
    cVar3 = cVar14 + '\x04';
    if (bVar2) break;
LAB_013f248f:
    cVar14 = cVar3;
    if (pSVar9 < (StringUtil *)0x64) {
      cVar14 = cVar14 + -2;
      goto LAB_013f24cc;
    }
    if (pSVar9 < (StringUtil *)0x3e8) {
      cVar14 = cVar14 + -1;
      goto LAB_013f24cc;
    }
  }
  cVar14 = cVar14 + '\x01';
LAB_013f24cc:
  pSVar9 = local_88[lVar7];
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar14);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_50,local_48,(unsigned_long)pSVar8);
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_50);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_b8 = *puVar10;
    lStack_b0 = plVar6[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar10;
    local_c8 = (ulong *)*plVar6;
  }
  local_c0 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar4 = (ulong)((long)pSVar9 * 10) / bytes;
  cVar14 = '\x01';
  if (9 < uVar4) {
    uVar11 = uVar4;
    cVar3 = '\x04';
    do {
      cVar14 = cVar3;
      if (uVar11 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_013f25d2;
      }
      if (uVar11 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_013f25d2;
      }
      if (uVar11 < 10000) goto LAB_013f25d2;
      bVar2 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar3 = cVar14 + '\x04';
    } while (bVar2);
    cVar14 = cVar14 + '\x01';
  }
LAB_013f25d2:
  local_e8 = local_d8;
  ::std::__cxx11::string::_M_construct((ulong)&local_e8,cVar14);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,uVar4);
  uVar4 = CONCAT44(uStack_dc,local_e0) + local_c0;
  uVar11 = 0xf;
  if (local_c8 != &local_b8) {
    uVar11 = local_b8;
  }
  if (uVar11 < uVar4) {
    uVar11 = 0xf;
    if (local_e8 != local_d8) {
      uVar11 = local_d8[0];
    }
    if (uVar11 < uVar4) goto LAB_013f263a;
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_013f263a:
    puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
  }
  local_108 = &local_f8;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_f8 = *puVar1;
    uStack_f0 = puVar5[3];
  }
  else {
    local_f8 = *puVar1;
    local_108 = (undefined8 *)*puVar5;
  }
  local_100 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_108);
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_98 = *plVar12;
    uStack_90 = plVar6[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar12;
    local_a8 = (long *)*plVar6;
  }
  local_a0 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar13 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar13) {
    lVar7 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  plVar6 = local_50;
  if (local_50 == local_40) {
    return __return_storage_ptr__;
  }
LAB_013f27ad:
  operator_delete(plVar6);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::BytesToHumanReadableString(idx_t bytes, idx_t multiplier) {
	D_ASSERT(multiplier == 1000 || multiplier == 1024);
	idx_t array[6] = {};
	const char *unit[2][6] = {{"bytes", "KiB", "MiB", "GiB", "TiB", "PiB"}, {"bytes", "kB", "MB", "GB", "TB", "PB"}};

	const int sel = (multiplier == 1000);

	array[0] = bytes;
	for (idx_t i = 1; i < 6; i++) {
		array[i] = array[i - 1] / multiplier;
		array[i - 1] %= multiplier;
	}

	for (idx_t i = 5; i >= 1; i--) {
		if (array[i]) {
			// Map 0 -> 0 and (multiplier-1) -> 9
			idx_t fractional_part = (array[i - 1] * 10) / multiplier;
			return to_string(array[i]) + "." + to_string(fractional_part) + " " + unit[sel][i];
		}
	}

	return to_string(array[0]) + (bytes == 1 ? " byte" : " bytes");
}